

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void av1_read_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r,int x_mis,int y_mis)

{
  int_mv *piVar1;
  AV1_COMMON *cm;
  uint8_t *puVar2;
  MV_REFERENCE_FRAME *pMVar3;
  BLOCK_SIZE BVar4;
  InterpFilter IVar5;
  int iVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *mi;
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *pMVar9;
  SequenceHeader *pSVar10;
  undefined2 uVar11;
  undefined1 uVar12;
  byte bVar13;
  CFL_ALLOWED_TYPE CVar14;
  uint8_t uVar15;
  int8_t iVar16;
  MOTION_MODE MVar17;
  byte bVar18;
  byte bVar19;
  MV_REFERENCE_FRAME MVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int_mv iVar25;
  MV_REF *pMVar26;
  uint16_t *puVar27;
  RefCntBuffer *pRVar28;
  RefCntBuffer *pRVar29;
  char cVar30;
  PREDICTION_MODE PVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int_mv *ref;
  scale_factors *psVar37;
  int dir;
  int iVar38;
  int_mv *piVar39;
  aom_cdf_prob (*cdf) [4];
  int iVar40;
  MV *pMVar41;
  long lVar42;
  ushort uVar43;
  OrderHintInfo *oh;
  nmv_context *nmvc;
  FRAME_CONTEXT *pFVar44;
  MACROBLOCKD *xd;
  bool bVar45;
  undefined2 local_244;
  int8_t local_241;
  FRAME_CONTEXT *local_240;
  MV_REFERENCE_FRAME *local_238;
  ulong local_230;
  MV *local_228;
  int_mv local_220;
  int_mv aiStack_21c [2];
  int local_214;
  int_mv local_210 [2];
  CANDIDATE_MV (*local_208) [8];
  undefined8 local_200;
  uint16_t (*local_1f8) [8];
  MB_MODE_INFO *local_1f0;
  PREDICTION_MODE *local_1e8;
  aom_cdf_prob (*local_1e0) [3];
  int16_t inter_mode_ctx [29];
  int pts_inref [16];
  int pts [16];
  int_mv ref_mvs [29] [2];
  
  pMVar7 = *(dcb->xd).mi;
  *(ushort *)&pMVar7->field_0xa7 = *(ushort *)&pMVar7->field_0xa7 & 0xff7f;
  cm = &pbi->common;
  mi = *(dcb->xd).mi;
  local_214 = y_mis;
  if (((pbi->common).current_frame.frame_type & 0xfd) == 0) {
    pMVar7 = (dcb->xd).left_mbmi;
    local_1f0 = (dcb->xd).above_mbmi;
    BVar4 = mi->bsize;
    pFVar44 = (dcb->xd).tile_ctx;
    local_230 = CONCAT44(local_230._4_4_,(uint)BVar4);
    if ((pbi->common).seg.segid_preskip == '\0') {
      uVar22 = *(ushort *)&mi->field_0xa7 & 7;
    }
    else {
      uVar22 = read_intra_segment_id(cm,&dcb->xd,BVar4,r,0);
      uVar22 = uVar22 & 7;
      *(ushort *)&mi->field_0xa7 = *(ushort *)&mi->field_0xa7 & 0xfff8 | (ushort)uVar22;
    }
    uVar22 = read_skip_txfm(cm,&dcb->xd,uVar22,r);
    mi->skip_txfm = (uint8_t)uVar22;
    if ((pbi->common).seg.segid_preskip == '\0') {
      iVar23 = read_intra_segment_id(cm,&dcb->xd,(BLOCK_SIZE)local_230,r,uVar22 & 0xff);
      *(ushort *)&mi->field_0xa7 = *(ushort *)&mi->field_0xa7 & 0xfff8 | (ushort)iVar23 & 7;
    }
    read_cdef(cm,r,&dcb->xd);
    read_delta_q_params(cm,&dcb->xd,r);
    mi->current_qindex = (dcb->xd).current_base_qindex;
    mi->ref_frame[0] = '\0';
    mi->ref_frame[1] = -1;
    (mi->palette_mode_info).palette_size[0] = '\0';
    (mi->palette_mode_info).palette_size[1] = '\0';
    (mi->filter_intra_mode_info).use_filter_intra = '\0';
    (dcb->xd).above_txfm_context =
         (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
    (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
    if (((((pbi->common).current_frame.frame_type & 0xfd) == 0) &&
        ((pbi->common).features.allow_screen_content_tools == true)) &&
       ((pbi->common).features.allow_intrabc != false)) {
      pMVar8 = *(dcb->xd).mi;
      uVar22 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->intrabc_cdf,2);
      *(ushort *)&pMVar8->field_0xa7 =
           *(ushort *)&pMVar8->field_0xa7 & 0xff7f | (ushort)(byte)(uVar22 << 7);
      if ((uVar22 & 1) != 0) {
        local_238 = (MV_REFERENCE_FRAME *)(ulong)pMVar8->bsize;
        pMVar8->mode = '\0';
        pMVar8->uv_mode = '\0';
        (pMVar8->interp_filters).as_int = 0x30003;
        pMVar8->motion_mode = '\0';
        av1_find_mv_refs(cm,&dcb->xd,pMVar8,'\0',dcb->ref_mv_count,(dcb->xd).ref_mv_stack,
                         (dcb->xd).weight,(int_mv (*) [2])pts,(int_mv *)0x0,(int16_t *)ref_mvs);
        av1_find_best_ref_mvs(0,(int_mv *)pts,(int_mv *)pts_inref,(int_mv *)inter_mode_ctx,0);
        if (pts_inref[0] == 0) {
          pts_inref[0] = inter_mode_ctx._0_4_;
        }
        if (pts_inref[0] == 0) {
          iVar23 = ((pbi->common).seq_params)->mib_size;
          pts_inref[0] = iVar23 * 0xffe0 & 0xffff;
          if ((dcb->xd).mi_row - iVar23 < (dcb->xd).tile.mi_row_start) {
            pts_inref[0] = iVar23 * -0x200000 + 0xf8000000;
          }
        }
        _local_220 = (CANDIDATE_MV)
                     (CONCAT62(CONCAT42(aiStack_21c[0].as_int,(short)((uint)pts_inref[0] >> 0x10)),
                               (short)pts_inref[0]) & 0xfffffffffff8fff8);
        if ((((uint)pts_inref[0] >> 0x10 | pts_inref[0]) & 7) == 0) {
          piVar1 = pMVar8->mv;
          local_228 = (MV *)(ulong)(uint)(dcb->xd).mi_row;
          local_208 = (CANDIDATE_MV (*) [8])(ulong)(uint)(dcb->xd).mi_col;
          read_mv(r,&piVar1->as_mv,&local_220.as_mv,&((dcb->xd).tile_ctx)->ndvc,-1);
          pMVar8->mv[0].as_int = pMVar8->mv[0].as_int & 0xfff8fff8;
          iVar23 = is_mv_valid(&piVar1->as_mv);
          if (((iVar23 != 0) && (uVar22 = piVar1->as_int, (uVar22 & 7) == 0)) &&
             ((uVar22 & 0x70000) == 0)) {
            iVar23 = (int)local_228 * 0x20 + (int)(short)uVar22;
            iVar24 = (dcb->xd).tile.mi_row_start * 0x20;
            if (iVar24 <= iVar23) {
              iVar35 = (int)local_208 * 0x20 + ((int)uVar22 >> 0x10);
              uVar22 = (dcb->xd).tile.mi_col_start;
              iVar36 = uVar22 * 0x20;
              if ((iVar36 <= iVar35) &&
                 (iVar38 = iVar23 + (uint)(byte)local_238[0x424910] * 8,
                 iVar38 <= (dcb->xd).tile.mi_row_end * 0x20)) {
                iVar40 = iVar35 + (uint)(byte)local_238[0x4248f0] * 8;
                iVar6 = (dcb->xd).tile.mi_col_end;
                if (iVar40 <= iVar6 * 0x20) {
                  pSVar10 = (pbi->common).seq_params;
                  if ((((dcb->xd).is_chroma_ref != true) || (pSVar10->monochrome != '\0')) ||
                     ((((0x10003UL >> ((ulong)local_238 & 0x3f) & 1) == 0 ||
                       (((dcb->xd).plane[1].subsampling_x == 0 || (iVar36 + 0x20 <= iVar35)))) &&
                      (((0x20005UL >> ((ulong)local_238 & 0x3f) & 1) == 0 ||
                       (((dcb->xd).plane[1].subsampling_y == 0 || (iVar24 + 0x20 <= iVar23)))))))) {
                    bVar13 = (byte)pSVar10->mib_size_log2;
                    iVar35 = (int)local_228 >> (bVar13 & 0x1f);
                    iVar24 = 4 << (bVar13 & 0x1f);
                    iVar23 = ((iVar38 >> 3) + -1) / iVar24;
                    if (iVar23 <= iVar35) {
                      iVar36 = (int)local_208 >> 4;
                      iVar38 = (iVar40 >> 3) + -1 >> 6;
                      iVar40 = ((int)(iVar6 + ~uVar22) >> 4) + 1;
                      if ((iVar23 * iVar40 + iVar38 < iVar36 + iVar35 * iVar40 + -4) &&
                         (iVar38 < (int)((iVar35 - iVar23) * ((0x40 < iVar24) + 5) + iVar36 + -4)))
                      goto LAB_00166403;
                    }
                  }
                }
              }
            }
          }
        }
        aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid intrabc dv");
      }
LAB_00166403:
      iVar23 = local_214;
      if ((mi->field_0xa7 & 0x80) != 0) goto LAB_001665a7;
    }
    iVar23 = local_214;
    bVar13 = av1_above_block_mode(local_1f0);
    bVar19 = av1_left_block_mode(pMVar7);
    bVar13 = read_intra_mode(r,pFVar44->kf_y_cdf[intra_mode_context[bVar13]]
                               [intra_mode_context[bVar19]]);
    mi->mode = bVar13;
    iVar16 = '\0';
    if ((BLOCK_8X4 < BVar4) && (iVar16 = '\0', 0xf7 < (byte)(bVar13 - 9))) {
      iVar24 = read_angle_delta(r,pFVar44->angle_delta_cdf[(ulong)bVar13 - 1]);
      iVar16 = (int8_t)iVar24;
    }
    mi->angle_delta[0] = iVar16;
    lVar42 = 3;
    if (((pbi->common).seq_params)->monochrome == '\0') {
      if ((dcb->xd).is_chroma_ref == true) {
        CVar14 = is_cfl_allowed(&dcb->xd);
        bVar13 = read_intra_mode_uv(pFVar44,r,CVar14,mi->mode);
        mi->uv_mode = bVar13;
        if (bVar13 == 0xd) {
          uVar15 = read_cfl_alphas(pFVar44,r,&mi->cfl_alpha_signs);
          mi->cfl_alpha_idx = uVar15;
          bVar13 = mi->uv_mode;
        }
        uVar12 = 0;
        lVar42 = 0x59;
        if ((BLOCK_8X4 < BVar4) && (0xf7 < (byte)(get_uv_mode_uv2y[bVar13] - 9))) {
          iVar24 = read_angle_delta(r,pFVar44->angle_delta_cdf
                                      [(ulong)(byte)get_uv_mode_uv2y[bVar13] - 1]);
          uVar12 = (undefined1)iVar24;
        }
      }
      else {
        uVar12 = 0;
      }
    }
    else {
      uVar12 = 0;
    }
    *(undefined1 *)((long)mi->mv + lVar42 + -8) = uVar12;
    bVar13 = store_cfl_required(cm,&dcb->xd);
    (dcb->xd).cfl.store_y = (uint)bVar13;
    iVar24 = av1_allow_palette((uint)(pbi->common).features.allow_screen_content_tools,
                               (BLOCK_SIZE)local_230);
    if (iVar24 != 0) {
      read_palette_mode_info(cm,&dcb->xd,r);
    }
    read_filter_intra_mode_info(cm,&dcb->xd,r);
LAB_001665a7:
    if ((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs == 0) {
      return;
    }
    iVar35 = (pbi->common).mi_params.mi_cols + 1 >> 1;
    pMVar26 = ((pbi->common).cur_frame)->mvs +
              (long)(((dcb->xd).mi_row >> 1) * iVar35) + (long)((dcb->xd).mi_col >> 1);
    iVar24 = x_mis + 1 >> 1;
    iVar23 = iVar23 + 1 >> 1;
    iVar36 = 0;
    if (iVar24 < 1) {
      iVar24 = iVar36;
    }
    if (iVar23 < 1) {
      iVar23 = iVar36;
    }
    for (; iVar36 != iVar23; iVar36 = iVar36 + 1) {
      for (lVar42 = 0; iVar24 != (int)lVar42; lVar42 = lVar42 + 1) {
        pMVar26[lVar42].ref_frame = -1;
      }
      pMVar26 = pMVar26 + iVar35;
    }
    return;
  }
  mi->mv[0] = (int_mv)0x0;
  mi->mv[1] = (int_mv)0x0;
  uVar21 = read_inter_segment_id(cm,&dcb->xd,1,r);
  uVar21 = uVar21 & 7;
  uVar34 = *(ushort *)&mi->field_0xa7 & 0xfffffff8 | uVar21;
  *(short *)&mi->field_0xa7 = (short)uVar34;
  uVar22 = 0;
  if ((pbi->common).current_frame.skip_mode_info.skip_mode_flag != 0) {
    uVar15 = (pbi->common).seg.enabled;
    if ((uVar15 == '\0') || (((pbi->common).seg.feature_mask[uVar21] & 0x40) == 0)) {
      BVar4 = (*(dcb->xd).mi)->bsize;
      bVar13 = block_size_high[BVar4];
      if (block_size_wide[BVar4] < block_size_high[BVar4]) {
        bVar13 = block_size_wide[BVar4];
      }
      if ((7 < bVar13) &&
         ((uVar15 == '\0' || (uVar22 = 0, ((pbi->common).seg.feature_mask[uVar21] & 0xa0) == 0)))) {
        pMVar8 = (dcb->xd).left_mbmi;
        pMVar9 = (dcb->xd).above_mbmi;
        if (pMVar9 == (MB_MODE_INFO *)0x0) {
          uVar32 = 0;
        }
        else {
          uVar32 = (ulong)(*(ushort *)&pMVar9->field_0xa7 >> 6 & 1);
        }
        if (pMVar8 == (MB_MODE_INFO *)0x0) {
          uVar33 = 0;
        }
        else {
          uVar33 = (ulong)(*(ushort *)&pMVar8->field_0xa7 >> 6 & 1);
        }
        uVar22 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->skip_mode_cdfs[uVar33 + uVar32],2);
        uVar34 = (uint)*(ushort *)&mi->field_0xa7;
      }
    }
  }
  *(ushort *)&mi->field_0xa7 = (ushort)uVar34 & 0xffbf | (ushort)((uVar22 & 1) << 6);
  uVar15 = '\x01';
  if ((uVar22 & 1) == 0) {
    iVar23 = read_skip_txfm(cm,&dcb->xd,uVar34 & 7,r);
    uVar15 = (uint8_t)iVar23;
  }
  mi->skip_txfm = uVar15;
  local_1f0 = pMVar7;
  if ((pbi->common).seg.segid_preskip == '\0') {
    iVar23 = read_inter_segment_id(cm,&dcb->xd,0,r);
    *(ushort *)&mi->field_0xa7 = *(ushort *)&mi->field_0xa7 & 0xfff8 | (ushort)iVar23 & 7;
  }
  read_cdef(cm,r,&dcb->xd);
  read_delta_q_params(cm,&dcb->xd,r);
  if ((*(ushort *)&mi->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_0016675e:
      iVar23 = av1_get_intra_inter_context(&dcb->xd);
      uVar22 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->intra_inter_cdf[iVar23],2);
    }
    else {
      uVar21 = *(ushort *)&mi->field_0xa7 & 7;
      uVar22 = (pbi->common).seg.feature_mask[uVar21];
      if ((uVar22 & 0x20) == 0) {
        if (-1 < (char)uVar22) goto LAB_0016675e;
        uVar22 = 1;
      }
      else {
        uVar22 = (uint)(0 < *(short *)((long)(pbi->common).seg.feature_data[0] +
                                      (ulong)(uVar21 << 4) + 10));
      }
    }
    bVar45 = uVar22 == 0;
  }
  else {
    bVar45 = false;
  }
  mi->current_qindex = (dcb->xd).current_base_qindex;
  (dcb->xd).above_txfm_context =
       (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
  (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
  BVar4 = mi->bsize;
  local_230 = (ulong)BVar4;
  if (bVar45) {
    mi->ref_frame[0] = '\0';
    mi->ref_frame[1] = -1;
    pFVar44 = (dcb->xd).tile_ctx;
    bVar13 = read_intra_mode(r,pFVar44->y_mode_cdf[""[local_230]]);
    mi->mode = bVar13;
    iVar16 = '\0';
    if ((BLOCK_8X4 < BVar4) && (iVar16 = '\0', 0xf7 < (byte)(bVar13 - 9))) {
      iVar23 = read_angle_delta(r,pFVar44->angle_delta_cdf[(ulong)bVar13 - 1]);
      iVar16 = (int8_t)iVar23;
    }
    mi->angle_delta[0] = iVar16;
    lVar42 = 3;
    if ((((pbi->common).seq_params)->monochrome == '\0') && ((dcb->xd).is_chroma_ref == true)) {
      CVar14 = is_cfl_allowed(&dcb->xd);
      bVar13 = read_intra_mode_uv(pFVar44,r,CVar14,mi->mode);
      mi->uv_mode = bVar13;
      if (bVar13 == 0xd) {
        uVar15 = read_cfl_alphas((dcb->xd).tile_ctx,r,&mi->cfl_alpha_signs);
        mi->cfl_alpha_idx = uVar15;
        bVar13 = mi->uv_mode;
      }
      lVar42 = 0x59;
      uVar12 = 0;
      if ((2 < (byte)local_230) && (uVar12 = 0, 0xf7 < (byte)(get_uv_mode_uv2y[bVar13] - 9))) {
        iVar23 = read_angle_delta(r,pFVar44->angle_delta_cdf
                                    [(ulong)(byte)get_uv_mode_uv2y[bVar13] - 1]);
        uVar12 = (undefined1)iVar23;
      }
    }
    else {
      uVar12 = 0;
    }
    *(undefined1 *)((long)mi->mv + lVar42 + -8) = uVar12;
    bVar13 = store_cfl_required(cm,&dcb->xd);
    (dcb->xd).cfl.store_y = (uint)bVar13;
    (mi->palette_mode_info).palette_size[0] = '\0';
    (mi->palette_mode_info).palette_size[1] = '\0';
    iVar24 = av1_allow_palette((uint)(pbi->common).features.allow_screen_content_tools,
                               (BLOCK_SIZE)local_230);
    iVar23 = local_214;
    if (iVar24 != 0) {
      read_palette_mode_info(cm,&dcb->xd,r);
    }
    read_filter_intra_mode_info(cm,&dcb->xd,r);
    goto LAB_00167cf5;
  }
  bVar13 = (pbi->common).features.allow_high_precision_mv;
  uVar22 = (uint)bVar13;
  memset(ref_mvs,0,0xe8);
  local_240 = (dcb->xd).tile_ctx;
  mi->uv_mode = '\0';
  (mi->palette_mode_info).palette_size[0] = '\0';
  (mi->palette_mode_info).palette_size[1] = '\0';
  (dcb->xd).neighbors_ref_counts[0] = '\0';
  (dcb->xd).neighbors_ref_counts[1] = '\0';
  (dcb->xd).neighbors_ref_counts[2] = '\0';
  (dcb->xd).neighbors_ref_counts[3] = '\0';
  (dcb->xd).neighbors_ref_counts[4] = '\0';
  (dcb->xd).neighbors_ref_counts[5] = '\0';
  (dcb->xd).neighbors_ref_counts[6] = '\0';
  (dcb->xd).neighbors_ref_counts[7] = '\0';
  bVar45 = (dcb->xd).left_available;
  if ((dcb->xd).up_available == true) {
    pMVar7 = (dcb->xd).above_mbmi;
    if ((pMVar7->field_0xa7 & 0x80) != 0 || '\0' < pMVar7->ref_frame[0]) {
      puVar2 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[0];
      *puVar2 = *puVar2 + '\x01';
      if (0 < (long)pMVar7->ref_frame[1]) {
        puVar2 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[1];
        *puVar2 = *puVar2 + '\x01';
      }
    }
  }
  if (bVar45 != false) {
    pMVar7 = (dcb->xd).left_mbmi;
    if ((pMVar7->field_0xa7 & 0x80) != 0 || '\0' < pMVar7->ref_frame[0]) {
      puVar2 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[0];
      *puVar2 = *puVar2 + '\x01';
      if (0 < (long)pMVar7->ref_frame[1]) {
        puVar2 = (dcb->xd).neighbors_ref_counts + pMVar7->ref_frame[1];
        *puVar2 = *puVar2 + '\x01';
      }
    }
  }
  local_238 = mi->ref_frame;
  pMVar7 = *(dcb->xd).mi;
  if ((pMVar7->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_00166ad5:
      BVar4 = pMVar7->bsize;
      bVar19 = block_size_high[BVar4];
      if (block_size_wide[BVar4] < block_size_high[BVar4]) {
        bVar19 = block_size_wide[BVar4];
      }
      if (7 < bVar19) {
        bVar19 = (pbi->common).current_frame.reference_mode;
        uVar21 = (uint)bVar19;
        if (bVar19 == 2) {
          iVar23 = av1_get_reference_mode_context(&dcb->xd);
          uVar21 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_inter_cdf[iVar23],2);
        }
        if ((char)uVar21 != '\0') {
          if ((uVar21 & 0xff) == 1) {
            iVar23 = av1_get_comp_reference_type_context(&dcb->xd);
            iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_ref_type_cdf[iVar23],2);
            if ((char)iVar23 == '\0') {
              iVar23 = av1_get_pred_context_uni_comp_ref_p(&dcb->xd);
              iVar23 = aom_read_symbol_(r,(aom_cdf_prob *)
                                          (((dcb->xd).tile_ctx)->uni_comp_ref_cdf + iVar23),2);
              if (iVar23 == 0) {
                iVar23 = av1_get_pred_context_uni_comp_ref_p1(&dcb->xd);
                iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar23][1],2);
                if (iVar23 == 0) {
                  mi->ref_frame[0] = '\x01';
                  mi->ref_frame[1] = '\x02';
                  MVar20 = '\x02';
                }
                else {
                  iVar23 = av1_get_pred_context_uni_comp_ref_p2(&dcb->xd);
                  iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar23][2],2);
                  mi->ref_frame[0] = '\x01';
                  if (iVar23 == 0) {
                    mi->ref_frame[1] = '\x03';
                    MVar20 = '\x03';
                  }
                  else {
                    mi->ref_frame[1] = '\x04';
                    MVar20 = '\x04';
                  }
                }
                goto LAB_00166eef;
              }
              mi->ref_frame[0] = '\x05';
              mi->ref_frame[1] = '\a';
            }
            else {
              iVar23 = av1_get_pred_context_comp_ref_p(&dcb->xd);
              iVar23 = aom_read_symbol_(r,(aom_cdf_prob *)
                                          (((dcb->xd).tile_ctx)->comp_ref_cdf + iVar23),2);
              if (iVar23 == 0) {
                iVar23 = av1_get_pred_context_comp_ref_p1(&dcb->xd);
                iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_ref_cdf[iVar23][1],2);
                cVar30 = '\x02';
              }
              else {
                iVar23 = av1_get_pred_context_comp_ref_p2(&dcb->xd);
                iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_ref_cdf[iVar23][2],2);
                cVar30 = '\x04';
              }
              *local_238 = cVar30 - (iVar23 == 0);
              iVar23 = av1_get_pred_context_comp_bwdref_p(&dcb->xd);
              iVar23 = aom_read_symbol_(r,(aom_cdf_prob *)
                                          (((dcb->xd).tile_ctx)->comp_bwdref_cdf + iVar23),2);
              if (iVar23 == 0) {
                iVar23 = av1_get_pred_context_comp_bwdref_p1(&dcb->xd);
                iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->comp_bwdref_cdf[iVar23][1],2);
                MVar20 = '\x06' - (iVar23 == 0);
                goto LAB_00166ac9;
              }
              mi->ref_frame[1] = '\a';
            }
            MVar20 = '\a';
          }
          else {
            MVar20 = mi->ref_frame[1];
          }
          goto LAB_00166eef;
        }
      }
      pFVar44 = (dcb->xd).tile_ctx;
      iVar23 = av1_get_pred_context_single_ref_p1(&dcb->xd);
      iVar23 = aom_read_symbol_(r,(aom_cdf_prob *)(pFVar44->single_ref_cdf + iVar23),2);
      pFVar44 = (dcb->xd).tile_ctx;
      if (iVar23 == 0) {
        iVar23 = av1_get_pred_context_single_ref_p3(&dcb->xd);
        iVar23 = aom_read_symbol_(r,pFVar44->single_ref_cdf[iVar23][2],2);
        pFVar44 = (dcb->xd).tile_ctx;
        if (iVar23 == 0) {
          iVar23 = av1_get_pred_context_single_ref_p4(&dcb->xd);
          iVar23 = aom_read_symbol_(r,pFVar44->single_ref_cdf[iVar23][3],2);
          cVar30 = '\x02';
        }
        else {
          iVar23 = av1_get_pred_context_single_ref_p5(&dcb->xd);
          iVar23 = aom_read_symbol_(r,pFVar44->single_ref_cdf[iVar23][4],2);
          cVar30 = '\x04';
        }
        MVar20 = cVar30 - (iVar23 == 0);
      }
      else {
        iVar23 = av1_get_pred_context_single_ref_p2(&dcb->xd);
        iVar23 = aom_read_symbol_(r,pFVar44->single_ref_cdf[iVar23][1],2);
        MVar20 = '\a';
        if (iVar23 == 0) {
          pFVar44 = (dcb->xd).tile_ctx;
          iVar23 = av1_get_pred_context_single_ref_p6(&dcb->xd);
          iVar23 = aom_read_symbol_(r,pFVar44->single_ref_cdf[iVar23][5],2);
          MVar20 = '\x06' - (iVar23 == 0);
        }
      }
      mi->ref_frame[0] = MVar20;
      mi->ref_frame[1] = -1;
      MVar20 = -1;
    }
    else {
      uVar34 = *(ushort *)&mi->field_0xa7 & 7;
      uVar21 = (pbi->common).seg.feature_mask[uVar34];
      if ((uVar21 & 0x20) == 0) {
        if ((uVar21 & 0xc0) == 0) goto LAB_00166ad5;
        mi->ref_frame[0] = '\x01';
        mi->ref_frame[1] = -1;
      }
      else {
        mi->ref_frame[0] =
             *(MV_REFERENCE_FRAME *)
              ((long)(pbi->common).seg.feature_data[0] + (ulong)(uVar34 << 4) + 10);
        mi->ref_frame[1] = -1;
      }
      MVar20 = -1;
    }
  }
  else {
    mi->ref_frame[0] = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_0 + '\x01';
    MVar20 = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_1 + '\x01';
LAB_00166ac9:
    mi->ref_frame[1] = MVar20;
  }
LAB_00166eef:
  local_241 = av1_ref_frame_type(local_238);
  puVar2 = dcb->ref_mv_count;
  local_208 = (dcb->xd).ref_mv_stack;
  local_228 = (MV *)(dcb->xd).weight;
  av1_find_mv_refs(cm,&dcb->xd,mi,local_241,puVar2,local_208,(uint16_t (*) [8])local_228,ref_mvs,
                   (int_mv *)0x0,inter_mode_ctx);
  uVar43 = *(ushort *)&mi->field_0xa7;
  *(ushort *)&mi->field_0xa7 = uVar43 & 0xffcf;
  PVar31 = '\x11';
  if (((uVar43 & 0x40) != 0) ||
     (((pbi->common).seg.enabled != '\0' &&
      (PVar31 = '\x0f', ((pbi->common).seg.feature_mask[uVar43 & 7] & 0xc0) != 0))))
  goto LAB_00166f83;
  iVar16 = av1_ref_frame_type(local_238);
  puVar27 = (uint16_t *)(inter_mode_ctx + iVar16);
  if ('\0' < mi->ref_frame[1]) {
    uVar21 = *puVar27 & 7;
    uVar32 = 4;
    if ((ushort)uVar21 < 4) {
      uVar32 = (ulong)uVar21;
    }
    puVar27 = compound_mode_ctx_map[*puVar27 >> 5 & 7] + uVar32;
  }
  uVar43 = *puVar27;
  if (MVar20 < '\x01') {
    iVar23 = aom_read_symbol_(r,local_240->newmv_cdf[uVar43 & 7],2);
    if (iVar23 == 0) {
      uVar21 = 0x10;
LAB_001679f1:
      mi->mode = (PREDICTION_MODE)uVar21;
      goto LAB_00167a01;
    }
    iVar23 = aom_read_symbol_(r,local_240->zeromv_cdf[uVar43 >> 3 & 1],2);
    if (iVar23 == 0) {
      PVar31 = '\x0f';
    }
    else {
      iVar23 = aom_read_symbol_(r,local_240->refmv_cdf[uVar43 >> 4 & 0xf],2);
      uVar21 = 0xe;
      if (iVar23 != 0) goto LAB_001679f1;
      PVar31 = '\r';
    }
LAB_00166f83:
    mi->mode = PVar31;
  }
  else {
    uVar34 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->inter_compound_mode_cdf[(short)uVar43],8);
    uVar21 = uVar34 + 0x11;
    local_1e8 = &mi->mode;
    mi->mode = (PREDICTION_MODE)uVar21;
    if (((((byte)uVar34 < 8) && ((0xb2U >> (uVar34 & 0x1f) & 1) != 0)) || ((uVar34 & 0xff) == 0xff))
       || ((uVar34 & 0xff) == 0xfd)) {
LAB_00167a01:
      local_1e8 = &mi->mode;
      bVar18 = av1_ref_frame_type(local_238);
      mi->field_0xa7 = mi->field_0xa7 & 0xcf;
      bVar19 = (byte)uVar21;
      if ((uVar21 & 0xff | 8) == 0x18) {
        local_1f8 = (uint16_t (*) [8])((long)local_228 + (ulong)bVar18 * 0x10);
        local_1e0 = local_240->drl_cdf;
        uVar21 = 0;
        do {
          do {
            uVar34 = uVar21;
            if (uVar34 == 2) {
              bVar19 = *local_1e8;
              goto LAB_00167acd;
            }
            uVar21 = uVar34 + 1;
          } while (puVar2[bVar18] <= uVar21);
          bVar19 = av1_drl_ctx(*local_1f8,uVar34);
          iVar23 = aom_read_symbol_(r,local_1e0[bVar19],2);
          *(ushort *)&mi->field_0xa7 =
               *(ushort *)&mi->field_0xa7 & 0xffcf | (ushort)((uVar34 + iVar23 & 3) << 4);
        } while (iVar23 != 0);
      }
      else {
LAB_00167acd:
        iVar23 = 1;
        if ((bVar19 < 0x17) && ((0x644000U >> (bVar19 & 0x1f) & 1) != 0)) {
          local_228 = (MV *)((long)local_228 + (ulong)bVar18 * 0x10);
          local_1f8 = (uint16_t (*) [8])local_240->drl_cdf;
          for (uVar21 = 2; uVar21 != 4; uVar21 = uVar21 + 1) {
            if (uVar21 < puVar2[bVar18]) {
              bVar19 = av1_drl_ctx((uint16_t *)local_228,iVar23);
              iVar24 = aom_read_symbol_(r,*local_1f8 + (ulong)bVar19 * 3,2);
              *(ushort *)&mi->field_0xa7 =
                   *(ushort *)&mi->field_0xa7 & 0xffcf |
                   ((short)iVar24 + (short)iVar23) * 0x10 + 0x30U & 0x30;
              if (iVar24 == 0) break;
            }
            iVar23 = iVar23 + 1;
          }
        }
      }
    }
  }
  bVar19 = mi->mode;
  if ((byte)(bVar19 - 0x19) < 0xf8 == '\0' < MVar20) {
    aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Prediction mode %d invalid with ref frame %d %d",(ulong)bVar19,
                       (ulong)(uint)(int)mi->ref_frame[0],(ulong)(uint)(int)mi->ref_frame[1]);
    bVar19 = mi->mode;
  }
  pMVar41 = (MV *)(long)local_241;
  if (MVar20 < '\x01') {
    bVar18 = 0xf;
    if (bVar19 != 0xf) {
      av1_find_best_ref_mvs
                (uVar22,ref_mvs[mi->ref_frame[0]],&local_220,(int_mv *)&local_200,
                 (uint)(pbi->common).features.cur_frame_force_integer_mv);
      bVar18 = mi->mode;
    }
LAB_001670cb:
    bVar19 = bVar18;
    uVar21 = (uint)*(ushort *)&mi->field_0xa7;
    uVar43 = *(ushort *)&mi->field_0xa7 >> 4;
    if (((uVar43 & 3) != 0) && (bVar19 == 0xe)) {
      local_200 = CONCAT44(local_200._4_4_,
                           local_208[*local_238][(ulong)(uVar43 & 3) + 1].this_mv.as_int);
      bVar19 = 0xe;
    }
  }
  else {
    bVar18 = 0x17;
    if (bVar19 == 0x17) goto LAB_001670cb;
    uVar21 = (uint)*(ushort *)&mi->field_0xa7;
    _local_220 = local_208[(long)pMVar41][0];
    local_200 = *(undefined8 *)
                 ((long)&local_208[(long)pMVar41][1].this_mv +
                 (ulong)(*(ushort *)&mi->field_0xa7 >> 1 & 0x18));
    bVar45 = (pbi->common).features.cur_frame_force_integer_mv;
    uVar34 = (uint)bVar45;
    local_228 = pMVar41;
    lower_mv_precision(&local_220.as_mv,uVar22,uVar34);
    lower_mv_precision(&aiStack_21c[0].as_mv,uVar22,(uint)bVar45);
    lower_mv_precision((MV *)&local_200,uVar22,uVar34);
    lower_mv_precision((MV *)((long)&local_200 + 4),uVar22,uVar34);
    pMVar41 = local_228;
  }
  piVar1 = mi->mv;
  piVar39 = mi->mv + 1;
  local_210[0].as_int = local_220.as_int;
  local_210[1].as_int = aiStack_21c[0].as_int;
  local_228 = (MV *)piVar39;
  if (MVar20 < '\x01') {
    if (bVar19 != 0x10) goto LAB_001671d2;
    if (1 < puVar2[(long)pMVar41]) {
      local_210[0] = local_208[(long)pMVar41][uVar21 >> 4 & 3].this_mv;
    }
    pFVar44 = (dcb->xd).tile_ctx;
    if ((pbi->common).features.cur_frame_force_integer_mv != false) {
      bVar13 = 0xff;
    }
switchD_0016721a_caseD_10:
    ref = local_210;
    piVar39 = piVar1;
    goto LAB_0016750d;
  }
  uVar43 = ((ushort)(uVar21 >> 4) & 3) + (ushort)((byte)(bVar19 - 0x15) < 2);
  if ((0x1510000UL >> ((ulong)bVar19 & 0x3f) & 1) != 0) {
    local_210[0] = local_208[(long)pMVar41][uVar43].this_mv;
  }
  if ((0x1280000UL >> ((ulong)bVar19 & 0x3f) & 1) != 0) {
    local_210[1] = local_208[(long)pMVar41][uVar43].comp_mv;
  }
LAB_001671d2:
  bVar45 = (pbi->common).features.cur_frame_force_integer_mv;
  if (bVar45 != false) {
    bVar13 = 0xff;
  }
  if (0xb < bVar19 - 0xd) {
    uVar22 = 0;
    uVar32 = local_230;
    goto LAB_00167551;
  }
  ref = local_210 + 1;
  pFVar44 = (dcb->xd).tile_ctx;
  BVar4 = (*(dcb->xd).mi)->bsize;
  iVar25.as_int = local_220.as_int;
  switch((uint)bVar19) {
  case 0xd:
    goto switchD_0016721a_caseD_d;
  case 0xe:
    iVar25.as_int = local_200._0_4_;
    goto switchD_0016721a_caseD_d;
  case 0xf:
    iVar25 = gm_get_motion_vector
                       ((pbi->common).global_motion + *local_238,
                        (uint)(pbi->common).features.allow_high_precision_mv,BVar4,(dcb->xd).mi_col,
                        (dcb->xd).mi_row,(uint)bVar45);
switchD_0016721a_caseD_d:
    piVar1->as_int = (uint32_t)iVar25;
    break;
  case 0x10:
    goto switchD_0016721a_caseD_10;
  case 0x11:
    piVar1->as_int = (uint32_t)local_220;
    piVar39->as_int = (uint32_t)aiStack_21c[0];
    break;
  case 0x12:
    *(undefined8 *)piVar1 = local_200;
    break;
  case 0x13:
    goto LAB_001674ff;
  case 0x14:
    read_mv(r,&piVar1->as_mv,&local_210[0].as_mv,&pFVar44->nmvc,bVar13);
    iVar25.as_int = aiStack_21c[0].as_int;
    goto LAB_0016746b;
  case 0x15:
    iVar25.as_int = local_200._0_4_;
LAB_001674ff:
    piVar1->as_int = (uint32_t)iVar25;
LAB_0016750d:
    read_mv(r,&piVar39->as_mv,&ref->as_mv,&pFVar44->nmvc,bVar13);
    break;
  case 0x16:
    read_mv(r,&piVar1->as_mv,&local_210[0].as_mv,&pFVar44->nmvc,bVar13);
    iVar25.as_int = local_200._4_4_;
LAB_0016746b:
    piVar39->as_int = (uint32_t)iVar25;
    break;
  case 0x17:
    iVar25 = gm_get_motion_vector
                       ((pbi->common).global_motion + mi->ref_frame[0],
                        (uint)(pbi->common).features.allow_high_precision_mv,BVar4,(dcb->xd).mi_col,
                        (dcb->xd).mi_row,(uint)bVar45);
    mi->mv[0] = iVar25;
    iVar25 = gm_get_motion_vector
                       ((pbi->common).global_motion + mi->ref_frame[1],
                        (uint)(pbi->common).features.allow_high_precision_mv,BVar4,(dcb->xd).mi_col,
                        (dcb->xd).mi_row,(uint)(pbi->common).features.cur_frame_force_integer_mv);
    mi->mv[1] = iVar25;
    break;
  case 0x18:
    for (lVar42 = 0; lVar42 != 8; lVar42 = lVar42 + 4) {
      read_mv(r,(MV *)((long)piVar1 + lVar42),(MV *)((long)local_210 + lVar42),&pFVar44->nmvc,bVar13
             );
    }
  }
  uVar22 = is_mv_valid(&piVar1->as_mv);
  uVar32 = local_230;
  if ('\0' < MVar20) {
    if (uVar22 == 0) {
      uVar22 = 0;
    }
    else {
      uVar22 = is_mv_valid(local_228);
    }
  }
LAB_00167551:
  aom_merge_corrupted_flag(&dcb->corrupted,uVar22 ^ 1);
  uVar43 = *(ushort *)&mi->field_0xa7;
  *(ushort *)&mi->field_0xa7 = uVar43 & 0xfbff;
  if ((((((pbi->common).seq_params)->enable_interintra_compound != '\0') && ((uVar43 & 0x40) == 0))
      && (0xf8 < (byte)(mi->bsize - BLOCK_32X64))) &&
     (((0xfb < (byte)(mi->mode - 0x11) && ('\0' < *local_238)) && (mi->ref_frame[1] < '\x01')))) {
    bVar13 = ""[uVar32];
    iVar23 = aom_read_symbol_(r,local_240->interintra_cdf[bVar13],2);
    if (iVar23 != 0) {
      iVar23 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->interintra_mode_cdf[bVar13],4);
      mi->ref_frame[1] = '\0';
      mi->interintra_mode = (INTERINTRA_MODE)iVar23;
      mi->angle_delta[0] = '\0';
      mi->angle_delta[1] = '\0';
      (mi->filter_intra_mode_info).use_filter_intra = '\0';
      if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                      (ulong)(uint)((int)uVar32 << 5))) {
        uVar22 = aom_read_symbol_(r,local_240->wedge_interintra_cdf[uVar32],2);
        *(ushort *)&mi->field_0xa7 =
             *(ushort *)&mi->field_0xa7 & 0xfbff | (ushort)((uVar22 & 1) << 10);
        if ((uVar22 & 1) != 0) {
          iVar23 = aom_read_symbol_(r,local_240->wedge_idx_cdf[uVar32],0x10);
          mi->interintra_wedge_index = (int8_t)iVar23;
        }
      }
    }
  }
  for (uVar32 = 0; cVar30 = mi->ref_frame[1], uVar32 <= ('\0' < cVar30); uVar32 = uVar32 + 1) {
    if (((byte)(mi->ref_frame[uVar32] - 1U) < 8) &&
       (iVar23 = (pbi->common).remapped_ref_idx[(byte)mi->ref_frame[uVar32] - 1], iVar23 != -1)) {
      psVar37 = (pbi->common).ref_scale_factors + iVar23;
    }
    else {
      psVar37 = (scale_factors *)0x0;
    }
    (dcb->xd).block_ref_scale_factors[uVar32] = psVar37;
  }
  mi->motion_mode = '\0';
  bVar13 = block_size_high[mi->bsize];
  if (block_size_wide[mi->bsize] < block_size_high[mi->bsize]) {
    bVar13 = block_size_wide[mi->bsize];
  }
  if (((7 < bVar13) && (cVar30 < '\x01')) && ((*(ushort *)&mi->field_0xa7 & 0x40) == 0)) {
    uVar15 = av1_findSamples(cm,&dcb->xd,pts,pts_inref);
    mi->num_proj_ref = uVar15;
  }
  av1_count_overlappable_neighbors(cm,&dcb->xd);
  if (mi->ref_frame[1] == '\0') {
    bVar45 = false;
  }
  else {
    if ((((pbi->common).features.switchable_motion_mode == false) || ((mi->field_0xa7 & 0x40) != 0))
       || (mi->overlappable_neighbors == '\0')) {
LAB_0016779f:
      MVar17 = '\0';
    }
    else {
      iVar23 = (dcb->xd).cur_frame_force_integer_mv;
      BVar4 = mi->bsize;
      if (iVar23 == 0) {
        bVar13 = block_size_high[BVar4];
        if (block_size_wide[BVar4] < block_size_high[BVar4]) {
          bVar13 = block_size_wide[BVar4];
        }
        if (((1 < (dcb->xd).global_motion[mi->ref_frame[0]].wmtype) &&
            ((mi->mode - 0xf & 0xf7) == 0)) && (7 < bVar13)) goto LAB_0016779f;
      }
      else {
        bVar13 = block_size_high[BVar4];
        if (block_size_wide[BVar4] < block_size_high[BVar4]) {
          bVar13 = block_size_wide[BVar4];
        }
      }
      if (bVar13 < 8) goto LAB_0016779f;
      MVar17 = '\0';
      if ((mi->ref_frame[1] < '\0') && (0xf3 < (byte)(mi->mode - 0x19))) {
        if ((iVar23 == 0) &&
           (((pbi->common).features.allow_warped_motion != false && (mi->num_proj_ref != '\0')))) {
          psVar37 = (dcb->xd).block_ref_scale_factors[0];
          iVar23 = psVar37->x_scale_fp;
          if ((iVar23 != -1) &&
             ((iVar24 = psVar37->y_scale_fp, iVar24 != -1 && (iVar24 != 0x4000 || iVar23 != 0x4000))
             )) goto LAB_00167f63;
          cdf = ((dcb->xd).tile_ctx)->motion_mode_cdf + BVar4;
          iVar23 = 3;
        }
        else {
LAB_00167f63:
          cdf = (aom_cdf_prob (*) [4])(((dcb->xd).tile_ctx)->obmc_cdf + BVar4);
          iVar23 = 2;
        }
        iVar23 = aom_read_symbol_(r,*cdf,iVar23);
        MVar17 = (MOTION_MODE)iVar23;
      }
    }
    mi->motion_mode = MVar17;
    bVar45 = '\0' < mi->ref_frame[1];
  }
  uVar32 = local_230;
  uVar43 = *(ushort *)&mi->field_0xa7;
  uVar22 = uVar43 & 0xfffffcff | 0x200;
  *(short *)&mi->field_0xa7 = (short)uVar22;
  (mi->interinter_comp).type = '\0';
  if ((bool)((uVar43 & 0x40) == 0 & bVar45)) {
    bVar13 = block_size_high[local_230];
    if (block_size_wide[local_230] < block_size_high[local_230]) {
      bVar13 = block_size_wide[local_230];
    }
    BVar4 = (BLOCK_SIZE)local_230;
    if (7 < bVar13) {
      for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
        if ((1 < uVar21) &&
           (iVar23 = is_interinter_compound_used((COMPOUND_TYPE)uVar21,BVar4), iVar23 != 0)) {
          if (((pbi->common).seq_params)->enable_masked_compound != '\0') {
            pMVar7 = (dcb->xd).left_mbmi;
            pMVar8 = (dcb->xd).above_mbmi;
            uVar21 = 0;
            uVar22 = 0;
            if (pMVar8 != (MB_MODE_INFO *)0x0) {
              if (pMVar8->ref_frame[1] < '\x01') {
                uVar22 = (uint)(pMVar8->ref_frame[0] == '\a') * 3;
              }
              else {
                uVar22 = *(ushort *)&pMVar8->field_0xa7 >> 8 & 1;
              }
            }
            if (pMVar7 != (MB_MODE_INFO *)0x0) {
              if (pMVar7->ref_frame[1] < '\x01') {
                uVar21 = (uint)(pMVar7->ref_frame[0] == '\a') * 3;
              }
              else {
                uVar21 = *(ushort *)&pMVar7->field_0xa7 >> 8 & 1;
              }
            }
            uVar33 = 5;
            if (uVar21 + uVar22 < 5) {
              uVar33 = (ulong)(uVar21 + uVar22);
            }
            uVar22 = aom_read_symbol_(r,local_240->comp_group_idx_cdf[uVar33],2);
            uVar22 = *(ushort *)&mi->field_0xa7 & 0xfffffeff | (uVar22 & 1) << 8;
            *(short *)&mi->field_0xa7 = (short)uVar22;
          }
          break;
        }
      }
    }
    if ((uVar22 >> 8 & 1) == 0) {
      pSVar10 = (pbi->common).seq_params;
      if ((pSVar10->order_hint_info).enable_dist_wtd_comp == 0) {
        *(ushort *)&mi->field_0xa7 = (ushort)uVar22 | 0x200;
        (mi->interinter_comp).type = '\0';
      }
      else {
        pMVar7 = *(dcb->xd).mi;
        pRVar28 = get_ref_frame_buf(cm,pMVar7->ref_frame[0]);
        pRVar29 = get_ref_frame_buf(cm,pMVar7->ref_frame[1]);
        uVar21 = 0;
        uVar22 = 0;
        if (pRVar28 != (RefCntBuffer *)0x0) {
          uVar22 = pRVar28->order_hint;
        }
        uVar34 = ((pbi->common).cur_frame)->order_hint;
        if (pRVar29 != (RefCntBuffer *)0x0) {
          uVar21 = pRVar29->order_hint;
        }
        oh = &pSVar10->order_hint_info;
        iVar23 = get_relative_dist(oh,uVar21,uVar34);
        iVar24 = get_relative_dist(oh,uVar34,uVar22);
        pMVar7 = (dcb->xd).left_mbmi;
        pMVar8 = (dcb->xd).above_mbmi;
        if (pMVar8 == (MB_MODE_INFO *)0x0) {
          uVar32 = 0;
        }
        else if (pMVar8->ref_frame[1] < '\x01') {
          uVar32 = (ulong)(pMVar8->ref_frame[0] == '\a');
        }
        else {
          uVar32 = (ulong)(*(ushort *)&pMVar8->field_0xa7 >> 9 & 1);
        }
        if (pMVar7 == (MB_MODE_INFO *)0x0) {
          uVar33 = 0;
        }
        else if (pMVar7->ref_frame[1] < '\x01') {
          uVar33 = (ulong)(pMVar7->ref_frame[0] == '\a');
        }
        else {
          uVar33 = (ulong)(*(ushort *)&pMVar7->field_0xa7 >> 9 & 1);
        }
        iVar35 = -iVar23;
        if (0 < iVar23) {
          iVar35 = iVar23;
        }
        iVar23 = -iVar24;
        if (0 < iVar24) {
          iVar23 = iVar24;
        }
        uVar22 = aom_read_symbol_(r,local_240->compound_index_cdf
                                    [uVar32 + uVar33 + (ulong)(iVar35 == iVar23) * 3],2);
        *(ushort *)&mi->field_0xa7 =
             *(ushort *)&mi->field_0xa7 & 0xfdff | (ushort)((uVar22 & 1) << 9);
        (mi->interinter_comp).type = ~(byte)uVar22 & 1;
      }
    }
    else {
      iVar23 = is_interinter_compound_used('\x02',BVar4);
      pFVar44 = local_240;
      if (iVar23 == 0) {
        (mi->interinter_comp).type = '\x03';
      }
      else {
        iVar23 = aom_read_symbol_(r,local_240->compound_type_cdf[uVar32],2);
        (mi->interinter_comp).type = (char)iVar23 + '\x02';
        if ((char)iVar23 == '\0') {
          iVar23 = aom_read_symbol_(r,pFVar44->wedge_idx_cdf[uVar32],0x10);
          (mi->interinter_comp).wedge_index = (int8_t)iVar23;
          iVar23 = aom_read_bit_(r);
          (mi->interinter_comp).wedge_sign = (int8_t)iVar23;
          goto LAB_00167c15;
        }
      }
      iVar23 = aom_read_literal_(r,1);
      (mi->interinter_comp).mask_type = (DIFFWTD_MASK_TYPE)iVar23;
    }
  }
LAB_00167c15:
  IVar5 = (pbi->common).features.interp_filter;
  pMVar7 = *(dcb->xd).mi;
  if (((pMVar7->field_0xa7 & 0x40) == 0) && (pMVar7->motion_mode != '\x02')) {
    uVar15 = ((pbi->common).seq_params)->enable_dual_filter;
    pFVar44 = (dcb->xd).tile_ctx;
    if ((pMVar7->mode == '\x17') || (pMVar7->mode == '\x0f')) {
      bVar13 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar7->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar7->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar7->bsize]) {
        bVar13 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar7->bsize];
      }
      if (1 < bVar13) {
        lVar42 = 0;
        do {
          if ((ulong)('\0' < pMVar7->ref_frame[1]) + 1 == lVar42) goto LAB_00167c43;
          pMVar3 = pMVar7->ref_frame + lVar42;
          lVar42 = lVar42 + 1;
        } while ((dcb->xd).global_motion[*pMVar3].wmtype != '\x01');
      }
    }
    uVar22 = (uint)IVar5;
    if (uVar22 != 4) goto LAB_00167c51;
    local_244 = 0;
    lVar42 = 0;
    do {
      uVar11 = local_244;
      if (lVar42 == 2) goto LAB_00167e1d;
      iVar23 = av1_get_pred_context_switchable_interp(&dcb->xd,(int)lVar42);
      iVar23 = aom_read_symbol_(r,pFVar44->switchable_interp_cdf[iVar23],3);
      *(char *)((long)&local_244 + lVar42) = (char)iVar23;
      lVar42 = lVar42 + 1;
    } while (uVar15 != '\0');
    uVar11 = CONCAT11((undefined1)local_244,(undefined1)local_244);
LAB_00167e1d:
    (mi->interp_filters).as_int = CONCAT12((char)((ushort)uVar11 >> 8),uVar11) & 0xffff00ff;
  }
  else {
LAB_00167c43:
    uVar22 = 0;
    if (IVar5 != 4) {
      uVar22 = (uint)IVar5;
    }
LAB_00167c51:
    (mi->interp_filters).as_int = uVar22 * 0x10001;
  }
  if (mi->motion_mode == '\x02') {
    iVar23 = (dcb->xd).mi_row;
    iVar24 = (dcb->xd).mi_col;
    (mi->wm_params).wmtype = '\x03';
    (mi->wm_params).invalid = '\0';
    bVar13 = mi->num_proj_ref;
    if (1 < bVar13) {
      bVar13 = av1_selectSamples(&piVar1->as_mv,pts,pts_inref,(uint)bVar13,(BLOCK_SIZE)local_230);
      mi->num_proj_ref = bVar13;
    }
    iVar23 = av1_find_projection((uint)bVar13,pts,pts_inref,(BLOCK_SIZE)local_230,
                                 (int)mi->mv[0].as_mv.row,(int)mi->mv[0].as_mv.col,&mi->wm_params,
                                 iVar23,iVar24);
    if (iVar23 != 0) {
      (mi->wm_params).invalid = '\x01';
    }
  }
  bVar13 = store_cfl_required(cm,&dcb->xd);
  (dcb->xd).cfl.store_y = (uint)bVar13;
  iVar23 = local_214;
LAB_00167cf5:
  if ((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) {
    av1_copy_frame_mvs(cm,local_1f0,(dcb->xd).mi_row,(dcb->xd).mi_col,x_mis,iVar23);
  }
  return;
}

Assistant:

void av1_read_mode_info(AV1Decoder *const pbi, DecoderCodingBlock *dcb,
                        aom_reader *r, int x_mis, int y_mis) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mi = xd->mi[0];
  mi->use_intrabc = 0;

  if (frame_is_intra_only(cm)) {
    read_intra_frame_mode_info(cm, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      intra_copy_frame_mvs(cm, xd->mi_row, xd->mi_col, x_mis, y_mis);
  } else {
    read_inter_frame_mode_info(pbi, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      av1_copy_frame_mvs(cm, mi, xd->mi_row, xd->mi_col, x_mis, y_mis);
  }
}